

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O1

int ImStb::stb_text_locate_coord(ImGuiInputTextState *str,float x,float y)

{
  ImWchar *text_begin;
  unsigned_short *puVar1;
  bool bVar2;
  int iVar3;
  undefined1 in_R8B;
  int iVar4;
  int line_start_idx;
  int iVar5;
  float fVar6;
  ImVec2 IVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  ImWchar *local_38;
  
  iVar5 = str->CurLenW;
  bVar2 = 0 < iVar5;
  if (iVar5 < 1) {
    line_start_idx = 0;
    IVar7.x = 0.0;
    IVar7.y = 0.0;
    iVar3 = 0;
  }
  else {
    fVar10 = 0.0;
    line_start_idx = 0;
    do {
      puVar1 = (str->TextW).Data;
      local_38 = (ImWchar *)0x0;
      text_begin = puVar1 + line_start_idx;
      IVar7 = InputTextCalcTextSizeW
                        (text_begin,puVar1 + str->CurLenW,&local_38,(ImVec2 *)0x1,(bool)in_R8B);
      iVar3 = (int)((ulong)((long)local_38 - (long)text_begin) >> 1);
      if (iVar3 < 1) {
        return iVar5;
      }
      if ((y < fVar10) && (line_start_idx == 0)) {
        return 0;
      }
      fVar10 = fVar10 + IVar7.y;
      if (y < fVar10) break;
      line_start_idx = line_start_idx + iVar3;
      bVar2 = line_start_idx < iVar5;
    } while (line_start_idx < iVar5);
  }
  iVar4 = iVar5;
  if ((bVar2) && (iVar4 = line_start_idx, 0.0 <= x)) {
    if ((x < IVar7.x) && (0 < iVar3)) {
      iVar4 = 0;
      fVar10 = 0.0;
      do {
        fVar6 = STB_TEXTEDIT_GETWIDTH(str,line_start_idx,iVar4);
        fVar8 = fVar10 + fVar6;
        fVar9 = fVar8;
        if (x < fVar8) {
          iVar5 = line_start_idx + 1;
          if (x < fVar6 * 0.5 + fVar10) {
            iVar5 = line_start_idx;
          }
          iVar5 = iVar5 + iVar4;
          fVar9 = fVar10;
        }
        if (x < fVar8) {
          return iVar5;
        }
        iVar4 = iVar4 + 1;
        fVar10 = fVar9;
      } while (iVar3 != iVar4);
    }
    iVar4 = iVar3 + line_start_idx;
    if ((str->TextW).Size < iVar4) {
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.h"
                    ,0x4d8,
                    "const T &ImVector<unsigned short>::operator[](int) const [T = unsigned short]")
      ;
    }
    if ((str->TextW).Data[(long)iVar4 + -1] == 10) {
      iVar4 = iVar4 + -1;
    }
  }
  return iVar4;
}

Assistant:

static int stb_text_locate_coord(STB_TEXTEDIT_STRING *str, float x, float y)
{
   StbTexteditRow r;
   int n = STB_TEXTEDIT_STRINGLEN(str);
   float base_y = 0, prev_x;
   int i=0, k;

   r.x0 = r.x1 = 0;
   r.ymin = r.ymax = 0;
   r.num_chars = 0;

   // search rows to find one that straddles 'y'
   while (i < n) {
      STB_TEXTEDIT_LAYOUTROW(&r, str, i);
      if (r.num_chars <= 0)
         return n;

      if (i==0 && y < base_y + r.ymin)
         return 0;

      if (y < base_y + r.ymax)
         break;

      i += r.num_chars;
      base_y += r.baseline_y_delta;
   }

   // below all text, return 'after' last character
   if (i >= n)
      return n;

   // check if it's before the beginning of the line
   if (x < r.x0)
      return i;

   // check if it's before the end of the line
   if (x < r.x1) {
      // search characters in row for one that straddles 'x'
      prev_x = r.x0;
      for (k=0; k < r.num_chars; ++k) {
         float w = STB_TEXTEDIT_GETWIDTH(str, i, k);
         if (x < prev_x+w) {
            if (x < prev_x+w/2)
               return k+i;
            else
               return k+i+1;
         }
         prev_x += w;
      }
      // shouldn't happen, but if it does, fall through to end-of-line case
   }

   // if the last character is a newline, return that. otherwise return 'after' the last character
   if (STB_TEXTEDIT_GETCHAR(str, i+r.num_chars-1) == STB_TEXTEDIT_NEWLINE)
      return i+r.num_chars-1;
   else
      return i+r.num_chars;
}